

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_algoim_K.H
# Opt level: O0

void __thiscall
amrex::algoim::ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>::
evalIntegrand(ImplicitIntegral<3,_3,_amrex::algoim::EBPlane,_amrex::algoim::QuadratureRule,_true>
              *this,GpuArray<double,_3U> x,Real w)

{
  int *piVar1;
  long *in_RDI;
  literals *this_00;
  double in_XMM0_Qa;
  Real RVar2;
  Real RVar3;
  double dVar4;
  double extraout_XMM0_Qa;
  double in_stack_00000008;
  double in_stack_00000010;
  double in_stack_00000018;
  int dim;
  Real mag;
  int i;
  Real xroot;
  Real phi_lo;
  int nroots;
  Real x_max;
  Real x_min;
  GpuArray<double,_4U> roots;
  Real gauss_w [4];
  Real gauss_x [4];
  int in_stack_fffffffffffffd04;
  int local_2a4;
  double local_2a0;
  int local_294;
  int local_27c;
  double local_268 [4];
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  double local_208;
  undefined4 local_1f4;
  long local_1f0;
  int local_1e4;
  long local_1e0;
  int local_1d4;
  long local_1d0;
  int local_1c4;
  long local_1c0;
  int local_1b4;
  undefined8 *local_1b0;
  int local_1a4;
  undefined8 *local_1a0;
  int local_194;
  undefined8 *local_190;
  undefined8 *local_188;
  double *local_180;
  undefined4 local_174;
  double *local_170;
  undefined4 local_164;
  double *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  double *local_140;
  undefined4 local_134;
  double *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  double *local_110;
  undefined4 local_104;
  double *local_100;
  undefined4 local_f4;
  undefined8 *local_f0;
  int local_e4;
  long local_e0;
  int local_d4;
  long local_d0;
  int local_c4;
  long local_c0;
  undefined4 local_b4;
  long local_b0;
  double local_a8;
  undefined8 *local_a0;
  int *local_98;
  undefined4 local_8c;
  undefined8 *local_88;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  int local_5c;
  int *local_58;
  int local_4c;
  int *local_48;
  int local_3c;
  int *local_38;
  int local_2c;
  int *local_28;
  int local_1c;
  double *local_18;
  undefined4 local_c;
  double *local_8;
  
  local_228 = 0x3fb1c6490c2719ec;
  local_220 = 0x3fd51ee013116102;
  local_218 = 0x3fe5708ff6774f7f;
  local_210 = 0x3fedc736de7b1cc3;
  local_248 = 0x3fc64340f7e7b66b;
  local_240 = 0x3fd4de5f840c24ca;
  local_238 = 0x3fd4de5f840c24ca;
  local_230 = 0x3fc64340f7e7b66b;
  local_208 = in_XMM0_Qa;
  RVar2 = BoundingBox<3>::min(in_stack_fffffffffffffd04);
  RVar3 = BoundingBox<3>::max(in_stack_fffffffffffffd04);
  local_27c = 0;
  local_194 = (int)in_RDI[4];
  (&stack0x00000008)[local_194] = RVar2;
  local_180 = (double *)*in_RDI;
  local_f4 = 0;
  local_104 = 0;
  local_110 = local_180 + 3;
  local_114 = 0;
  local_124 = 1;
  local_134 = 1;
  local_140 = local_180 + 3;
  local_144 = 1;
  local_154 = 2;
  local_164 = 2;
  this_00 = (literals *)0x2;
  local_170 = local_180 + 3;
  local_174 = 2;
  local_1a4 = (int)in_RDI[4];
  local_1c0 = *in_RDI;
  local_1c4 = (int)in_RDI[4];
  local_e0 = local_1c0 + 0x18;
  dVar4 = (&stack0x00000008)[local_1a4] -
          ((in_stack_00000018 - local_180[2]) * local_180[5] +
          (in_stack_00000008 - *local_180) * *local_110 +
          (in_stack_00000010 - local_180[1]) * local_180[4]) /
          *(double *)(local_e0 + (long)local_1c4 * 8);
  if ((RVar2 < dVar4) && (dVar4 < RVar3)) {
    local_27c = 1;
    local_8 = local_268;
    local_c = 0;
    local_268[0] = dVar4;
  }
  local_1a0 = &stack0x00000008;
  local_190 = &stack0x00000008;
  local_188 = &stack0x00000008;
  local_160 = local_180;
  local_150 = &stack0x00000008;
  local_130 = local_180;
  local_120 = &stack0x00000008;
  local_100 = local_180;
  local_f0 = &stack0x00000008;
  local_e4 = local_1c4;
  for (local_294 = 0; local_294 < local_27c; local_294 = local_294 + 1) {
    local_18 = local_268;
    local_1c = local_294;
    local_1b4 = (int)in_RDI[4];
    (&stack0x00000008)[local_1b4] = local_18[local_294];
    local_1b0 = &stack0x00000008;
    local_2a0 = literals::operator____rt(this_00,(longdouble)0);
    for (local_2a4 = 0; local_2a4 < 3; local_2a4 = local_2a4 + 1) {
      local_1d0 = *in_RDI;
      local_1d4 = local_2a4;
      local_d0 = local_1d0 + 0x18;
      local_d4 = local_2a4;
      local_1e0 = *in_RDI;
      local_1e4 = local_2a4;
      local_c0 = local_1e0 + 0x18;
      local_c4 = local_2a4;
      local_2a0 = *(double *)(local_d0 + (long)local_2a4 * 8) *
                  *(double *)(local_c0 + (long)local_2a4 * 8) + local_2a0;
    }
    dVar4 = sqrt(local_2a0);
    piVar1 = (int *)in_RDI[1];
    local_1f0 = *in_RDI;
    local_1f4 = (undefined4)in_RDI[4];
    local_b0 = local_1f0 + 0x18;
    local_b4 = local_1f4;
    std::abs((int)this_00);
    local_a8 = (dVar4 / extraout_XMM0_Qa) * local_208;
    local_6c = 0;
    local_28 = piVar1 + 2;
    local_2c = *piVar1;
    *(double *)(local_28 + (long)local_2c * 8) = in_stack_00000008;
    local_7c = 1;
    local_38 = piVar1 + 2;
    local_3c = *piVar1;
    *(double *)(local_38 + (long)local_3c * 8 + 2) = in_stack_00000010;
    local_8c = 2;
    local_48 = piVar1 + 2;
    local_4c = *piVar1;
    *(double *)(local_48 + (long)local_4c * 8 + 4) = in_stack_00000018;
    local_58 = piVar1 + 2;
    local_5c = *piVar1;
    *(double *)(local_58 + (long)local_5c * 8 + 6) = local_a8;
    *piVar1 = *piVar1 + 1;
    local_a0 = &stack0x00000008;
    local_98 = piVar1;
    local_88 = &stack0x00000008;
    local_78 = &stack0x00000008;
    local_68 = &stack0x00000008;
  }
  return;
}

Assistant:

AMREX_GPU_HOST_DEVICE
    void evalIntegrand (GpuArray<Real,N> x, Real w) const noexcept
    {
        constexpr Real gauss_x[4]={0.069431844202973712388026755553595247452_rt,
                                   0.33000947820757186759866712044837765640_rt,
                                   0.66999052179242813240133287955162234360_rt,
                                   0.93056815579702628761197324444640475255_rt};
        constexpr Real gauss_w[4]={0.173927422568726928686531974610999703618_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.326072577431273071313468025389000296382_rt,
                                   0.173927422568726928686531974610999703618_rt};

        // Each thread has its own storage for computing roots. These
        // are not corrupted by the recursive chain of evalIntegrand()
        // calls since each call is in a different templated
        // namespace. Moreover, if using OpenMP tasking, each task is
        // assumed tied and so one thread can only execute
        // "evalIntegrand" from start to end uninterrupted.
        GpuArray<Real,4> roots;

        // Surface integral
        if (S)
        {
            AMREX_ASSERT(M == N && N >= 2); // x is thus valid in all variables except e0

            Real x_min = xrange.min(e0);
            Real x_max = xrange.max(e0);
            int nroots = 0;

            x[e0] = x_min;
            Real phi_lo = phi(x);
            Real xroot = x[e0] - phi_lo / phi.grad(e0);
            if (xroot > x_min && xroot < x_max) {
                roots[nroots++] = xroot;
            }

            AMREX_ASSERT(nroots <= 1);

            for (int i = 0; i < nroots; ++i)
            {
                x[e0] = roots[i];
                Real mag = 0._rt;
                for (int dim = 0; dim < N; ++dim) {
                    mag += phi.grad(dim)*phi.grad(dim);
                }
                mag = std::sqrt(mag);
                f.evalIntegrand(x, (mag/amrex::Math::abs(phi.grad(e0)))*w);
            }

            return;
        }

        // Partition [xmin(e0), xmax(e0)] by roots found
        Real x_min = xrange.min(e0);
        Real x_max = xrange.max(e0);
        roots[0] = x_min;
        int nroots = 1;
        if (phi.grad(e0) != Real(0.0)) {
            for (int i = 0; i < psiCount; ++i)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[i].side(dim),dim);
                    }
                }
                // x is now valid in all variables except e0
                x[e0] = x_min;
                Real phi_lo = phi(x);
                Real xroot = x[e0] - phi_lo / phi.grad(e0);
                if (xroot > x_min && xroot < x_max) {
                    roots[nroots++] = xroot;
                }
            }
            AMREX_ASSERT(nroots <= 3);
        }
        if (nroots == 3 && roots[1] > roots[2]) {
            detail::swap(roots[1],roots[2]);
        }
        roots[nroots++] = x_max;

        // In rare cases, degenerate segments can be found, filter out with a tolerance
        static constexpr Real eps = std::numeric_limits<Real>::epsilon();
        constexpr Real tol = 50.0*eps;

        // Loop over segments of divided interval
        for (int i = 0; i < nroots - 1; ++i)
        {
            if (roots[i+1] - roots[i] < tol) continue;

            // Evaluate sign of phi within segment and check for consistency with psi
            bool okay = true;
            x[e0] = (roots[i] + roots[i+1])*0.5;
            for (int j = 0; j < psiCount && okay; ++j)
            {
                for (int dim = 0; dim < N; ++dim) {
                    if (!free[dim]) {
                        x[dim] = xrange(psi[j].side(dim), dim);
                    }
                }
                bool new_ok = (phi(x) > 0.0) ? (psi[j].sign() >= 0) : (psi[j].sign() <= 0);
                okay = okay && new_ok;
            }
            if (!okay) continue;

            for (int j = 0; j < p; ++j)
            {
                x[e0] = roots[i] + (roots[i+1] - roots[i]) * gauss_x[j];
                Real gw = (roots[i+1] - roots[i]) * gauss_w[j];
                f.evalIntegrand(x, w * gw);
            }
        }
    }